

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void Curl_hash_destroy(Curl_hash *h)

{
  Curl_llist *pCVar1;
  long lVar2;
  long lVar3;
  
  pCVar1 = h->table;
  if (pCVar1 != (Curl_llist *)0x0) {
    if (0 < h->slots) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        Curl_llist_destroy((Curl_llist *)((long)&h->table->head + lVar2),h);
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x20;
      } while (lVar3 < h->slots);
      pCVar1 = h->table;
    }
    (*Curl_cfree)(pCVar1);
    h->table = (Curl_llist *)0x0;
  }
  h->size = 0;
  h->slots = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  if(h->table) {
    int i;
    for(i = 0; i < h->slots; ++i) {
      Curl_llist_destroy(&h->table[i], (void *) h);
    }
    Curl_safefree(h->table);
  }
  h->size = 0;
  h->slots = 0;
}